

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

void MpiDestroyWriter(CP_Services Svcs,DP_WS_Stream WS_Stream_v)

{
  pthread_mutex_t *__mutex;
  pthread_rwlock_t *__rwlock;
  uint uVar1;
  uint *__ptr;
  undefined8 *puVar2;
  long *plVar3;
  void *__ptr_00;
  undefined8 *puVar4;
  MpiStreamWPR Stream;
  TimeStepsEntry Entry;
  long lVar5;
  
  (*Svcs->verbose)(*WS_Stream_v,5,"MpiDestroyWriter invoked [rank:%d]\n",
                   (ulong)*(uint *)((long)WS_Stream_v + 8));
  __mutex = (pthread_mutex_t *)((long)WS_Stream_v + 0x78);
  pthread_mutex_lock(__mutex);
  while (__ptr = *(uint **)((long)WS_Stream_v + 0x30), __ptr != (uint *)0x0) {
    puVar2 = *(undefined8 **)(__ptr + 6);
    uVar1 = *__ptr;
    (*Svcs->verbose)((void *)*puVar2,5,"MpiDestroyWriterPerReader invoked [rank:%d;cohortSize:%d]",
                     (ulong)uVar1,(ulong)*(uint *)(puVar2 + 1));
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (lVar5 = 0; (ulong)uVar1 * 8 != lVar5; lVar5 = lVar5 + 8) {
      if (*(undefined **)(*(long *)(__ptr + 0x1e) + lVar5) != &ompi_mpi_comm_null) {
        MPI_Comm_disconnect(*(long *)(__ptr + 0x1e) + lVar5);
      }
    }
    MPI_Close_port(__ptr + 0x20);
    free(*(void **)(__ptr + 0x1c));
    free(*(void **)(__ptr + 0x1e));
    pthread_mutex_lock((pthread_mutex_t *)(puVar2 + 0xf));
    lVar5 = *(long *)(__ptr + 0x120);
    plVar3 = *(long **)(__ptr + 0x122);
    puVar4 = (undefined8 *)(lVar5 + 0x488);
    if (lVar5 == 0) {
      puVar4 = puVar2 + 7;
    }
    *puVar4 = plVar3;
    *plVar3 = lVar5;
    pthread_mutex_unlock((pthread_mutex_t *)(puVar2 + 0xf));
    free(__ptr);
  }
  pthread_mutex_unlock(__mutex);
  __rwlock = (pthread_rwlock_t *)((long)WS_Stream_v + 0x40);
  pthread_rwlock_wrlock(__rwlock);
  plVar3 = (long *)((long)WS_Stream_v + 0x20);
  while (__ptr_00 = (void *)*plVar3, __ptr_00 != (void *)0x0) {
    lVar5 = *(long *)((long)__ptr_00 + 0x10);
    *plVar3 = lVar5;
    if (lVar5 == 0) {
      *(long **)((long)WS_Stream_v + 0x28) = plVar3;
    }
    free(*(void **)((long)__ptr_00 + 8));
    free(__ptr_00);
  }
  pthread_rwlock_unlock(__rwlock);
  pthread_mutex_destroy(__mutex);
  pthread_rwlock_destroy(__rwlock);
  free(WS_Stream_v);
  return;
}

Assistant:

static void MpiDestroyWriter(CP_Services Svcs, DP_WS_Stream WS_Stream_v)
{
    MpiStreamWR StreamWR = (MpiStreamWR)WS_Stream_v;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiDestroyWriter invoked [rank:%d]\n", StreamWR->Stream.Rank);

    pthread_mutex_lock(&StreamWR->MutexReaders);
    while (!TAILQ_EMPTY(&StreamWR->Readers))
    {
        MpiStreamWPR Stream = TAILQ_FIRST(&StreamWR->Readers);
        MpiDestroyWriterPerReader(Svcs, Stream);
    }
    pthread_mutex_unlock(&StreamWR->MutexReaders);

    pthread_rwlock_wrlock(&StreamWR->LockTS);
    while (!STAILQ_EMPTY(&StreamWR->TimeSteps))
    {
        TimeStepsEntry Entry = STAILQ_FIRST(&StreamWR->TimeSteps);
        STAILQ_REMOVE_HEAD(&StreamWR->TimeSteps, entries);
        free(Entry->Data);
        free(Entry);
    }
    pthread_rwlock_unlock(&StreamWR->LockTS);

    pthread_mutex_destroy(&StreamWR->MutexReaders);
    pthread_rwlock_destroy(&StreamWR->LockTS);
    free(StreamWR);
}